

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::Metadata::Metadata(Metadata *this)

{
  Timestamp *in_RDI;
  Tag *unaff_retaddr;
  nullptr_t in_stack_00000008;
  Function *in_stack_00000010;
  time_point_sys_clock *ptVar1;
  
  *(undefined1 *)&in_RDI->_vptr_Timestamp = 0;
  ptVar1 = &in_RDI->time_point;
  Tag::Tag(unaff_retaddr,in_RDI);
  Function::Function(in_stack_00000010,in_stack_00000008);
  Timestamp::Timestamp(in_RDI,ptVar1);
  return;
}

Assistant:

Metadata()
      : severity(Severity::trace),
        tag(nullptr),
        function(nullptr),
        timestamp(nullptr) {}